

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseMacroCall(Parser *this)

{
  _Base_ptr fmt;
  _Rb_tree_node_base *__k;
  _Base_ptr args_1;
  char cVar1;
  pointer pCVar2;
  bool bVar3;
  Token *this_00;
  Identifier *pIVar4;
  iterator iVar5;
  Token *pTVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  pointer pFVar9;
  pointer pTVar10;
  Parser *in_RSI;
  string *this_01;
  unsigned_long *in_R9;
  long lVar11;
  pointer local_1a0;
  optional<std::vector<Token,_std::allocator<Token>_>_> tokens;
  undefined1 local_168 [40];
  _Base_ptr local_140;
  string local_138;
  set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> identifierParameters;
  TokenStreamTokenizer macroTokenizer;
  _Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_> local_50;
  
  this_00 = peekToken(in_RSI,0);
  if (this_00->type == Identifier) {
    pIVar4 = Token::identifierValue(this_00);
    iVar5 = std::
            _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
            ::find(&(in_RSI->macros)._M_t,pIVar4);
    if ((_Rb_tree_header *)iVar5._M_node != &(in_RSI->macros)._M_t._M_impl.super__Rb_tree_header) {
      fmt = iVar5._M_node + 2;
      eatToken(in_RSI);
      Tokenizer::Tokenizer(&macroTokenizer.super_Tokenizer);
      identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header;
      identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1a0 = (pointer)(this->entries).
                           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = 0;
      pFVar9 = (pointer)0x0;
      identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           identifierParameters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_168._0_8_ = pFVar9;
        if ((pointer)((long)iVar5._M_node[3]._M_parent - *(long *)(iVar5._M_node + 3) >> 5) <=
            pFVar9) {
          (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0;
          pTVar6 = peekToken(in_RSI,0);
          if (pTVar6->type == Comma) {
            pTVar10 = (pointer)((long)iVar5._M_node[3]._M_parent - *(long *)(iVar5._M_node + 3) >> 5
                               );
            while (tokens.
                   super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                   .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>.
                   _M_payload._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Vector_impl_data._M_start = pTVar10, pTVar6 = peekToken(in_RSI,0),
                  pTVar6->type == Comma) {
              eatToken(in_RSI);
              extractMacroParameter
                        ((optional<std::vector<Token,_std::allocator<Token>_>_> *)&local_50,in_RSI,
                         this_00);
              std::_Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>::_M_reset
                        (&local_50);
              pTVar10 = (pointer)((long)&pTVar10->line + 1);
            }
            local_168._0_8_ = (long)iVar5._M_node[3]._M_parent - *(long *)(iVar5._M_node + 3) >> 5;
            printError<unsigned_long,unsigned_long>
                      (in_RSI,this_00,"Too many macro arguments (%d vs %d)",(unsigned_long *)&tokens
                       ,(unsigned_long *)local_168);
LAB_00140b13:
            (this->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            goto LAB_00140b1b;
          }
          pTVar6 = nextToken(in_RSI);
          if (pTVar6->type != Separator) {
            printError<>(in_RSI,this_00,"Macro call not terminated");
            goto LAB_00140b13;
          }
          pCVar2 = (in_RSI->conditionStack).
                   super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((pCVar2[-1].inUnknownBlock == false) && (pCVar2[-1].inTrueBlock == false)) {
            std::make_unique<DummyCommand>();
            local_1a0 = tokens.
                        super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                        .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>.
                        _M_payload._M_value.super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            if (in_RSI->initializingMacro != true) {
              if (*(long *)(iVar5._M_node + 6) == 0) {
                in_RSI->initializingMacro = true;
                TokenStreamTokenizer::init
                          (&macroTokenizer,(EVP_PKEY_CTX *)&iVar5._M_node[5]._M_parent);
                Logger::suppressLevel = Logger::suppressLevel + 1;
                ghc::filesystem::path::path((path *)&tokens);
                parse((Parser *)local_168,(Tokenizer *)in_RSI,SUB81(&macroTokenizer,0),(path *)0x1);
                ghc::filesystem::path::~path((path *)&tokens);
                if (Logger::suppressLevel != 0) {
                  Logger::suppressLevel = Logger::suppressLevel + -1;
                }
                std::
                _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                ::operator=((_Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                             *)&iVar5._M_node[3]._M_right,&(in_RSI->macroLabels)._M_t);
                std::
                _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
                ::clear(&(in_RSI->macroLabels)._M_t);
                in_RSI->initializingMacro = false;
                if ((pointer)local_168._0_8_ != (pointer)0x0) {
                  (**(code **)(*(long *)local_168._0_8_ + 8))();
                }
              }
              args_1 = iVar5._M_node + 6;
              p_Var8 = iVar5._M_node[4]._M_left;
              local_140 = iVar5._M_node + 4;
              local_168._32_8_ = in_RSI;
              goto LAB_00140c0c;
            }
            std::make_unique<DummyCommand>();
            local_1a0 = tokens.
                        super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                        .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>.
                        _M_payload._M_value.super__Vector_base<Token,_std::allocator<Token>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          }
          break;
        }
        pTVar6 = peekToken(in_RSI,0);
        if (pTVar6->type == Separator) {
          (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0;
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload.
          _M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)((long)iVar5._M_node[3]._M_parent - *(long *)(iVar5._M_node + 3) >> 5
                               );
          printError<unsigned_long,unsigned_long>
                    (in_RSI,this_00,"Too few macro arguments (%d vs %d)",(unsigned_long *)local_168,
                     (unsigned_long *)&tokens);
LAB_00140a7b:
          local_1a0 = (pointer)0x0;
          break;
        }
        if ((pFVar9 != (pointer)0x0) && (pTVar6 = nextToken(in_RSI), pTVar6->type != Comma)) {
          (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0;
          printError<>(in_RSI,this_00,"Macro arguments not comma-separated");
          goto LAB_00140a7b;
        }
        extractMacroParameter(&tokens,in_RSI,this_00);
        bVar3 = tokens.
                super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
                _M_payload.
                super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>.
                _M_engaged;
        if (tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
            super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_engaged ==
            false) {
          local_1a0 = (pointer)0x0;
        }
        else {
          if (((long)tokens.
                     super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
                     _M_payload.
                     super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                     .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>.
                     _M_payload._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._0_8_ == 0x60) &&
             ((tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
               .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload
               ._M_value.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_start)->type == Identifier)) {
            pIVar4 = Token::identifierValue
                               (tokens.
                                super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>
                                ._M_payload._M_value.
                                super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                                super__Vector_impl_data._M_start);
            std::
            _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
            ::_M_insert_unique<Identifier_const&>
                      ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                        *)&identifierParameters,pIVar4);
          }
          Tokenizer::registerReplacement
                    (&macroTokenizer.super_Tokenizer,
                     (Identifier *)(*(long *)(iVar5._M_node + 3) + lVar11),
                     (vector<Token,_std::allocator<Token>_> *)&tokens);
        }
        std::_Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>::_M_reset
                  ((_Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_> *)&tokens);
        pFVar9 = (pointer)((long)&pFVar9->tokenizer + 1);
        lVar11 = lVar11 + 0x20;
      } while (bVar3 != false);
      (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_1a0;
      goto LAB_00140b1b;
    }
  }
  (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  return (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>)this;
LAB_00140c0c:
  if (p_Var8 == local_140) goto LAB_00140db4;
  __k = p_Var8 + 1;
  iVar7 = std::
          _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
          ::find(&identifierParameters._M_t,(key_type *)__k);
  if ((_Rb_tree_header *)iVar7._M_node == &identifierParameters._M_t._M_impl.super__Rb_tree_header)
  {
    tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>._M_payload
    .super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload._M_value.
    super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&tokens.
                          super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
                          .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>
                          ._M_payload + 0x10);
    tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>._M_payload
    .super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload._M_value.
    super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>._M_payload
    .super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._M_payload._16_1_ = 0;
    std::__cxx11::string::string((string *)local_168,(string *)__k);
    if (((ulong)local_168._8_8_ < (pointer)0x2) || (*(char *)local_168._0_8_ != '@')) {
      std::__cxx11::string::~string((string *)local_168);
LAB_00140cca:
      std::__cxx11::string::string((string *)local_168,(string *)__k);
      if ((pointer)local_168._8_8_ == (pointer)0x0) {
        std::__cxx11::string::~string((string *)local_168);
      }
      else {
        cVar1 = *(char *)local_168._0_8_;
        std::__cxx11::string::~string((string *)local_168);
        if (cVar1 == '@') {
          std::__cxx11::string::substr((ulong)&local_138,(ulong)__k);
          tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                    ((string *)local_168,(tinyformat *)0x178042,(char *)fmt,(Identifier *)&local_138
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                     in_R9);
          goto LAB_00140d2b;
        }
      }
      tinyformat::format<Identifier,Identifier,unsigned_long>
                ((string *)local_168,(tinyformat *)0x178043,(char *)fmt,(Identifier *)__k,
                 (Identifier *)args_1,in_R9);
      std::__cxx11::string::operator=((string *)&tokens,(string *)local_168);
      this_01 = (string *)local_168;
    }
    else {
      cVar1 = *(char *)(local_168._0_8_ + 1);
      std::__cxx11::string::~string((string *)local_168);
      if (cVar1 != '@') goto LAB_00140cca;
      std::__cxx11::string::substr((ulong)&local_138,(ulong)__k);
      tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                ((string *)local_168,(tinyformat *)"@@%s_%s_%08X",(char *)fmt,
                 (Identifier *)&local_138,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,in_R9);
LAB_00140d2b:
      std::__cxx11::string::operator=((string *)&tokens,(string *)local_168);
      std::__cxx11::string::~string((string *)local_168);
      this_01 = &local_138;
    }
    std::__cxx11::string::~string((string *)this_01);
    Tokenizer::registerReplacement
              (&macroTokenizer.super_Tokenizer,(Identifier *)__k,(string *)&tokens);
    std::__cxx11::string::~string((string *)&tokens);
  }
  p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
  goto LAB_00140c0c;
LAB_00140db4:
  TokenStreamTokenizer::init(&macroTokenizer,(EVP_PKEY_CTX *)&iVar5._M_node[5]._M_parent);
  *(long *)args_1 = *(long *)args_1 + 1;
  ghc::filesystem::path::path((path *)&tokens);
  parse(this,(Tokenizer *)local_168._32_8_,SUB81(&macroTokenizer,0),(path *)0x1);
  ghc::filesystem::path::~path((path *)&tokens);
LAB_00140b1b:
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&identifierParameters._M_t);
  Tokenizer::~Tokenizer(&macroTokenizer.super_Tokenizer);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseMacroCall()
{
	const Token& start = peekToken();
	if (start.type != TokenType::Identifier)
		return nullptr;

	auto it = macros.find(start.identifierValue());
	if (it == macros.end())
		return nullptr;

	ParserMacro& macro = it->second;
	eatToken();

	// create a token stream for the macro content,
	// registering replacements for parameter values
	TokenStreamTokenizer macroTokenizer;

	std::set<Identifier> identifierParameters;
	for (size_t i = 0; i < macro.parameters.size(); i++)
	{
		if (peekToken().type == TokenType::Separator)
		{
			printError(start, "Too few macro arguments (%d vs %d)",i,macro.parameters.size());
			return nullptr;
		}

		if (i != 0)
		{
			if (nextToken().type != TokenType::Comma)
			{
				printError(start, "Macro arguments not comma-separated");
				return nullptr;
			}
		}

		auto tokens = extractMacroParameter(start);
		if (!tokens)
			return nullptr;

		// remember any single identifier parameters for the label replacement
		if (tokens->size() == 1 && tokens->front().type == TokenType::Identifier)
			identifierParameters.insert(tokens->front().identifierValue());

		// give them as a replacement to new tokenizer
		macroTokenizer.registerReplacement(macro.parameters[i], *tokens);
	}

	if (peekToken().type == TokenType::Comma)
	{
		size_t count = macro.parameters.size();
		while (peekToken().type == TokenType::Comma)
		{
			// skip comma
			eatToken();

			// skip parameter value
			extractMacroParameter(start);
			++count;
		}

		printError(start, "Too many macro arguments (%d vs %d)",count,macro.parameters.size());
		return nullptr;
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(start, "Macro call not terminated");
		return nullptr;
	}

	// skip macro instantiation in known false blocks
	if (!isInsideUnknownBlock() && !isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	// a macro is fully parsed once when it's loaded
	// to gather all labels. it's not necessary to
	// instantiate other macros at that time
	if (initializingMacro)
		return std::make_unique<DummyCommand>();

	// the first time a macro is instantiated, it needs to be analyzed
	// for labels
	if (macro.counter == 0)
	{
		initializingMacro = true;
		
		// parse the short lived next command
		macroTokenizer.init(macro.content);
		Logger::suppressErrors();
		std::unique_ptr<CAssemblerCommand> command =  parse(&macroTokenizer,true);
		Logger::unsuppressErrors();

		macro.labels = macroLabels;
		macroLabels.clear();
		
		initializingMacro = false;
	}

	// register labels and replacements
	for (const Identifier& label: macro.labels)
	{
		// check if the label is using the name of a parameter
		// in that case, don't register a unique replacement
		if (identifierParameters.find(label) != identifierParameters.end())
			continue;

		// otherwise make sure the name is unique
		std::string fullName;
		if (Global.symbolTable.isLocalSymbol(Identifier(label)))
			fullName = tfm::format("@@%s_%s_%08X",macro.name,label.string().substr(2),macro.counter);
		else if (Global.symbolTable.isStaticSymbol(Identifier(label)))
			fullName = tfm::format("@%s_%s_%08X",macro.name,label.string().substr(1),macro.counter);
		else
			fullName = tfm::format("%s_%s_%08X",macro.name,label,macro.counter);

		macroTokenizer.registerReplacement(label,fullName);
	}

	macroTokenizer.init(macro.content);
	macro.counter++;

	return parse(&macroTokenizer,true);

}